

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.h
# Opt level: O1

DynamicType * __thiscall Js::ConstructorCache::GetType(ConstructorCache *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (((this->super_PropertyGuard).value & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/ConstructorCache.h"
                                ,0x58,
                                "(static_cast<intptr_t>((CtorCacheGuardValues)__super::GetValue() & CtorCacheGuardValues::TagFlag) == 0)"
                                ,
                                "static_cast<intptr_t>((CtorCacheGuardValues)__super::GetValue() & CtorCacheGuardValues::TagFlag) == 0"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return (DynamicType *)(this->super_PropertyGuard).value;
}

Assistant:

DynamicType* GetType() const
        {
            Assert(static_cast<intptr_t>((CtorCacheGuardValues)__super::GetValue() & CtorCacheGuardValues::TagFlag) == 0);
            return reinterpret_cast<DynamicType*>(__super::GetValue());
        }